

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O2

SequenceExprSyntax * __thiscall
slang::parsing::Parser::parseDelayedSequenceExpr(Parser *this,SequenceExprSyntax *first)

{
  bool bVar1;
  int iVar2;
  ExpressionSyntax *delayVal;
  SelectorSyntax *range;
  SequenceExprSyntax *expr;
  undefined4 extraout_var;
  DelayedSequenceExprSyntax *pDVar3;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *ctx;
  Token doubleHash;
  Token TVar4;
  Token local_d8;
  EVP_PKEY_CTX *local_c8;
  DelayedSequenceElementSyntax *local_c0;
  Token local_b8;
  Token local_a8;
  SyntaxNode *local_98;
  SyntaxNode *pSStack_90;
  pointer local_80;
  SmallVector<slang::syntax::DelayedSequenceElementSyntax_*,_5UL> elements;
  
  elements.super_SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>.data_ =
       (pointer)elements.super_SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>.
                firstElement;
  elements.super_SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>.len = 0;
  elements.super_SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>.cap = 5;
  local_c8 = (EVP_PKEY_CTX *)first;
  do {
    Token::Token(&local_a8);
    Token::Token(&local_d8);
    Token::Token(&local_b8);
    doubleHash = ParserBase::expect(&this->super_ParserBase,DoubleHash);
    bVar1 = ParserBase::peek(&this->super_ParserBase,OpenBracket);
    if (bVar1) {
      local_d8 = ParserBase::consume(&this->super_ParserBase);
      bVar1 = ParserBase::peek(&this->super_ParserBase,Star);
      if (bVar1) {
LAB_002a5572:
        TVar4 = ParserBase::peek(&this->super_ParserBase,1);
        if (TVar4.kind != CloseBracket) goto LAB_002a55aa;
        local_a8 = ParserBase::consume(&this->super_ParserBase);
        range = (SelectorSyntax *)0x0;
      }
      else {
        bVar1 = ParserBase::peek(&this->super_ParserBase,Plus);
        if (bVar1) goto LAB_002a5572;
LAB_002a55aa:
        range = parseSequenceRange(this);
      }
      local_b8 = ParserBase::expect(&this->super_ParserBase,CloseBracket);
      delayVal = (ExpressionSyntax *)0x0;
    }
    else {
      delayVal = parsePrimaryExpression
                           (this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
      range = (SelectorSyntax *)0x0;
    }
    expr = parseSequencePrimary(this);
    local_c0 = slang::syntax::SyntaxFactory::delayedSequenceElement
                         (&this->factory,doubleHash,delayVal,local_d8,local_a8,range,local_b8,expr);
    SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax*>::
    emplace_back<slang::syntax::DelayedSequenceElementSyntax*>
              ((SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax*> *)&elements,&local_c0)
    ;
    bVar1 = ParserBase::peek(&this->super_ParserBase,DoubleHash);
    if (!bVar1) {
      iVar2 = SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>::copy
                        (&elements.
                          super_SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>,
                         (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
      local_80 = (pointer)CONCAT44(extraout_var,iVar2);
      local_a8.info._0_4_ = 1;
      local_98 = (SyntaxNode *)0x0;
      pSStack_90 = (SyntaxNode *)0x0;
      local_a8._0_8_ = &PTR_getChild_006a3d50;
      ctx = local_c8;
      pDVar3 = slang::syntax::SyntaxFactory::delayedSequenceExpr
                         (&this->factory,(SequenceExprSyntax *)local_c8,
                          (SyntaxList<slang::syntax::DelayedSequenceElementSyntax> *)&local_a8);
      SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>::cleanup
                (&elements.super_SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>,ctx)
      ;
      return &pDVar3->super_SequenceExprSyntax;
    }
  } while( true );
}

Assistant:

SequenceExprSyntax& Parser::parseDelayedSequenceExpr(SequenceExprSyntax* first) {
    SmallVector<DelayedSequenceElementSyntax*> elements;
    do {
        Token op, openBracket, closeBracket;
        SelectorSyntax* selector = nullptr;
        ExpressionSyntax* delayVal = nullptr;

        auto hash = expect(TokenKind::DoubleHash);

        if (peek(TokenKind::OpenBracket)) {
            openBracket = consume();
            if ((peek(TokenKind::Star) || peek(TokenKind::Plus)) &&
                peek(1).kind == TokenKind::CloseBracket) {
                op = consume();
            }
            else {
                selector = parseSequenceRange();
            }
            closeBracket = expect(TokenKind::CloseBracket);
        }
        else {
            delayVal = &parsePrimaryExpression(ExpressionOptions::None);
        }

        auto& expr = parseSequencePrimary();
        elements.push_back(&factory.delayedSequenceElement(hash, delayVal, openBracket, op,
                                                           selector, closeBracket, expr));

    } while (peek(TokenKind::DoubleHash));

    return factory.delayedSequenceExpr(first, elements.copy(alloc));
}